

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver_test.c
# Opt level: O0

_Bool has_v6(void)

{
  int iVar1;
  nni_plat_udp *pnStack_98;
  int rv;
  nni_plat_udp *u;
  nng_sockaddr sa;
  
  u._0_2_ = 4;
  u._2_2_ = 0;
  stack0xffffffffffffff74 = v6loop._0_8_;
  sa._4_8_ = v6loop._8_8_;
  iVar1 = nni_plat_udp_open(&stack0xffffffffffffff68,(nni_sockaddr *)&u);
  if (iVar1 == 0) {
    nni_plat_udp_close(pnStack_98);
  }
  return iVar1 == 0;
}

Assistant:

static bool
has_v6(void)
{
	nng_sockaddr  sa;
	nni_plat_udp *u;
	int           rv;

	sa.s_in6.sa_family = NNG_AF_INET6;
	sa.s_in6.sa_port   = 0;
	memcpy(sa.s_in6.sa_addr, v6loop, 16);

	rv = nni_plat_udp_open(&u, &sa);
	if (rv == 0) {
		nni_plat_udp_close(u);
	}
	return (rv == 0);
}